

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptorProto::InternalSwap
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *other)

{
  InternalMetadataWithArena *this_00;
  EnumValueDescriptorProto *other_local;
  EnumValueDescriptorProto *this_local;
  Container *local_30;
  
  std::swap<std::__cxx11::string*>(&(this->name_).ptr_,&(other->name_).ptr_);
  std::swap<google::protobuf::EnumValueOptions*>(&this->options_,&other->options_);
  std::swap<int>(&this->number_,&other->number_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_0052323d;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,&local_30->unknown_fields);
LAB_0052323d:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void EnumValueDescriptorProto::InternalSwap(EnumValueDescriptorProto* other) {
  name_.Swap(&other->name_);
  std::swap(options_, other->options_);
  std::swap(number_, other->number_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}